

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSwizzle::IntialStateTest::verifyValues(IntialStateTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  GLint alpha;
  GLint blue;
  GLint green;
  GLint red;
  GLint param [4];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  red = 0;
  green = 0;
  blue = 0;
  alpha = 0;
  param[0] = 0;
  param[1] = 0;
  param[2] = 0;
  param[3] = 0;
  (**(code **)(lVar3 + 0xab8))(texture_target,0x8e42,&red);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x935);
  (**(code **)(lVar3 + 0xab8))(texture_target,0x8e43,&green);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x937);
  (**(code **)(lVar3 + 0xab8))(texture_target,0x8e44,&blue);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x939);
  (**(code **)(lVar3 + 0xab8))(texture_target,0x8e45,&alpha);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x93b);
  (**(code **)(lVar3 + 0xab8))(texture_target,0x8e46,param);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexParameterIiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x93d);
  if (red == 0x1903) {
    if (green == 0x1904) {
      if (blue == 0x1905) {
        if (alpha == 0x1906) {
          if (param[0] == 0x1903) {
            if (param[1] == 0x1904) {
              if (param[2] == 0x1905) {
                if (param[3] == 0x1906) {
                  return;
                }
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Got invalid initial alpha state for TEXTURE_SWIZZLE_RGBA",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                           ,0x95e);
              }
              else {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Got invalid initial blue state for TEXTURE_SWIZZLE_RGBA",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                           ,0x95a);
              }
            }
            else {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Got invalid initial green state for TEXTURE_SWIZZLE_RGBA",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                         ,0x956);
            }
          }
          else {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Got invalid initial red state for TEXTURE_SWIZZLE_RGBA",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                       ,0x952);
          }
        }
        else {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Got invalid initial state for TEXTURE_SWIZZLE_A",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                     ,0x94d);
        }
      }
      else {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Got invalid initial state for TEXTURE_SWIZZLE_B",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                   ,0x949);
      }
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Got invalid initial state for TEXTURE_SWIZZLE_G",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0x945);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Got invalid initial state for TEXTURE_SWIZZLE_R",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x941);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void IntialStateTest::verifyValues(const glw::GLenum texture_target)
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint red		= 0;
	glw::GLint green	= 0;
	glw::GLint blue		= 0;
	glw::GLint alpha	= 0;
	glw::GLint param[4] = { 0 };

	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_R, &red);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_G, &green);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_B, &blue);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_A, &alpha);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");
	gl.getTexParameterIiv(texture_target, GL_TEXTURE_SWIZZLE_RGBA, param);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexParameterIiv");

	if (GL_RED != red)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_R");
	}
	if (GL_GREEN != green)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_G");
	}
	if (GL_BLUE != blue)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_B");
	}
	if (GL_ALPHA != alpha)
	{
		TCU_FAIL("Got invalid initial state for TEXTURE_SWIZZLE_A");
	}

	if (GL_RED != param[0])
	{
		TCU_FAIL("Got invalid initial red state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_GREEN != param[1])
	{
		TCU_FAIL("Got invalid initial green state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_BLUE != param[2])
	{
		TCU_FAIL("Got invalid initial blue state for TEXTURE_SWIZZLE_RGBA");
	}
	if (GL_ALPHA != param[3])
	{
		TCU_FAIL("Got invalid initial alpha state for TEXTURE_SWIZZLE_RGBA");
	}
}